

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_wrappers.hpp
# Opt level: O3

void __thiscall pcplusplus::threads::generic_threads::~generic_threads(generic_threads *this)

{
  thread *ptVar1;
  pointer pcVar2;
  long lVar3;
  undefined8 uVar4;
  char cVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer *__ptr;
  
  this->_vptr_generic_threads = (_func_int **)&PTR_thread_routine_00108ca8;
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 != '\0') {
    std::ofstream::close();
  }
  ptVar1 = (this->threads)._M_t.
           super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread[]>_>._M_t.
           super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread[]>_>.
           super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
  (this->threads)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread[]>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread[]>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  if (ptVar1 != (thread *)0x0) {
    std::default_delete<std::thread[]>::operator()
              ((default_delete<std::thread[]> *)&this->threads,ptVar1);
  }
  uVar4 = _memcpy;
  lVar3 = _VTT;
  *(long *)&this->logfile = _VTT;
  *(undefined8 *)(&this->logfile + *(long *)(lVar3 + -0x18)) = uVar4;
  std::filebuf::~filebuf((filebuf *)&this->field_0x68);
  std::ios_base::~ios_base((ios_base *)&this->field_0x158);
  ptVar1 = (this->threads)._M_t.
           super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread[]>_>._M_t.
           super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread[]>_>.
           super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
  if (ptVar1 != (thread *)0x0) {
    std::default_delete<std::thread[]>::operator()
              ((default_delete<std::thread[]> *)&this->threads,ptVar1);
  }
  (this->threads)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread[]>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread[]>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  pcVar2 = (this->thread_type)._M_dataplus._M_p;
  paVar6 = &(this->thread_type).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar6) {
    operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~generic_threads(){
		if(logfile.is_open())
		    logfile.close();
		threads.reset(nullptr);
	    }